

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

optional<std::array<float,_3UL>_> * __thiscall
tinyusdz::XformOp::get_value<std::array<float,3ul>>
          (optional<std::array<float,_3UL>_> *__return_storage_ptr__,XformOp *this,double t,
          TimeSampleInterpolationType interp)

{
  bool bVar1;
  PrimVar *this_00;
  array<float,_3UL> value;
  optional<std::array<float,_3UL>_> local_38;
  double local_28;
  
  this_00 = &this->_var;
  local_28 = t;
  bVar1 = primvar::PrimVar::is_timesamples(this_00);
  if (bVar1) {
    bVar1 = primvar::PrimVar::get_interpolated_value<std::array<float,3ul>>
                      (this_00,local_28,interp,(array<float,_3UL> *)&local_38);
    if (!bVar1) {
      *(undefined4 *)((long)&__return_storage_ptr__->contained + 8) = 0;
      *(undefined8 *)&__return_storage_ptr__->contained = 0;
    }
    else {
      *(undefined4 *)((long)&__return_storage_ptr__->contained + 8) = local_38.contained._4_4_;
      *(ulong *)&__return_storage_ptr__->contained =
           CONCAT44(local_38.contained.data.__align,local_38._0_4_);
    }
    __return_storage_ptr__->has_value_ = bVar1;
  }
  else {
    primvar::PrimVar::get_value<std::array<float,3ul>>(&local_38,this_00);
    __return_storage_ptr__->has_value_ = local_38.has_value_;
    if (local_38.has_value_ == true) {
      *(undefined4 *)((long)&__return_storage_ptr__->contained + 8) = local_38.contained._8_4_;
      *(ulong *)&__return_storage_ptr__->contained =
           CONCAT44(local_38.contained._4_4_,local_38.contained.data.__align);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value(double t = value::TimeCode::Default(), 
          value::TimeSampleInterpolationType interp =
               value::TimeSampleInterpolationType::Linear) const {
    if (is_timesamples()) {
      T value;
      if (get_interpolated_value(&value, t, interp)) {
        return value;
      }
      return nonstd::nullopt;
    }

    return _var.get_value<T>();
  }